

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::ProcessPolledData(RTPSession *this)

{
  RTCPScheduler *this_00;
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  RTCPCompoundPacket *pRVar5;
  bool bVar6;
  int iVar7;
  uint32_t ssrc;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var9;
  int unaff_R13D;
  RTPSources *pRVar10;
  RTCPCompoundPacket *pack;
  RTPTime t;
  RTPTime sendertimeout;
  RTPTime notetimeout;
  RTPTime colltimeout;
  RTPTime byetimeout;
  RTPTime generaltimeout;
  RTCPCompoundPacket *local_a8;
  RTPSources *local_a0;
  timespec local_98;
  RTCPScheduler *local_88;
  list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_> *local_80;
  RTCPPacketBuilder *local_78;
  RTPPacketBuilder *local_70;
  RTPCollisionList *local_68;
  timespec local_60;
  RTPTime local_50;
  RTPTime local_48;
  RTPTime local_40;
  RTPTime local_38;
  RTPRawPacket *rawpack;
  
  iVar7 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1f])();
  rawpack = (RTPRawPacket *)CONCAT44(extraout_var,iVar7);
  if (rawpack != (RTPRawPacket *)0x0) {
    pRVar10 = &(this->sources).super_RTPSources;
    local_68 = &this->collisionlist;
    local_78 = &this->rtcpbuilder;
    local_80 = &this->byepackets;
    local_88 = &this->rtcpsched;
    local_70 = &this->packetbuilder;
    do {
      if ((this->m_changeIncomingData != true) ||
         (iVar7 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x17])(this),
         (char)iVar7 != '\0')) {
        (this->sources).owncollision = false;
        iVar7 = RTPSources::ProcessRawPacket(pRVar10,rawpack,this->rtptrans,this->acceptownpackets);
        if (iVar7 < 0) {
          pRVar2 = (this->super_RTPMemoryObject).mgr;
          pp_Var3 = (rawpack->super_RTPMemoryObject)._vptr_RTPMemoryObject;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            (*pp_Var3[1])(rawpack);
            return iVar7;
          }
          (**pp_Var3)(rawpack);
          (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,rawpack);
          return iVar7;
        }
        if ((this->sources).owncollision == true) {
          local_98.tv_sec = (__time_t)(rawpack->receivetime).m_t;
          iVar7 = RTPCollisionList::UpdateAddress
                            (local_68,rawpack->senderaddress,(RTPTime *)&local_98,(bool *)&local_60)
          ;
          local_a0 = pRVar10;
          if (iVar7 < 0) {
LAB_0011cdc4:
            pRVar2 = (this->super_RTPMemoryObject).mgr;
            pp_Var3 = (rawpack->super_RTPMemoryObject)._vptr_RTPMemoryObject;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              (*pp_Var3[1])(rawpack);
            }
            else {
              (**pp_Var3)();
              (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
            }
            bVar6 = false;
            unaff_R13D = iVar7;
          }
          else {
            bVar6 = true;
            if ((char)local_60.tv_sec == '\x01') {
              if (this->sentpackets == true) {
                iVar7 = RTCPPacketBuilder::BuildBYEPacket
                                  (local_78,(RTCPCompoundPacket **)&local_98,(void *)0x0,0,
                                   this->useSR_BYEifpossible);
                if (iVar7 < 0) {
                  pRVar2 = (this->super_RTPMemoryObject).mgr;
                  pp_Var3 = (rawpack->super_RTPMemoryObject)._vptr_RTPMemoryObject;
                  unaff_R13D = iVar7;
                  if (pRVar2 == (RTPMemoryManager *)0x0) {
                    (*pp_Var3[1])(rawpack);
                  }
                  else {
                    (**pp_Var3)();
                    (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
                  }
                }
                else {
                  p_Var9 = (_List_node_base *)operator_new(0x18);
                  p_Var9[1]._M_next = (_List_node_base *)local_98.tv_sec;
                  std::__detail::_List_node_base::_M_hook(p_Var9);
                  sVar4 = (this->byepackets).
                          super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                          ._M_impl._M_node._M_size;
                  (this->byepackets).
                  super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                  ._M_impl._M_node._M_size = sVar4 + 1;
                  if (sVar4 == 0) {
                    RTCPScheduler::ScheduleBYEPacket
                              (local_88,(size_t)((_List_node_base *)(local_98.tv_sec + 0x20))->
                                                _M_next);
                  }
                }
                iVar8 = unaff_R13D;
                if (-1 < iVar7) goto LAB_0011cd6a;
              }
              else {
LAB_0011cd6a:
                pRVar10 = local_a0;
                ssrc = RTPPacketBuilder::CreateNewSSRC(local_70,local_a0);
                this->sentpackets = false;
                iVar7 = RTPSources::DeleteOwnSSRC(pRVar10);
                if (iVar7 < 0) goto LAB_0011cdc4;
                iVar8 = RTPSources::CreateOwnSSRC(pRVar10,ssrc);
                bVar6 = true;
                if (-1 < iVar8) goto LAB_0011cdf8;
                pRVar2 = (this->super_RTPMemoryObject).mgr;
                pp_Var3 = (rawpack->super_RTPMemoryObject)._vptr_RTPMemoryObject;
                if (pRVar2 == (RTPMemoryManager *)0x0) {
                  (*pp_Var3[1])(rawpack);
                }
                else {
                  (**pp_Var3)();
                  (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
                }
              }
              bVar6 = false;
              unaff_R13D = iVar8;
            }
          }
LAB_0011cdf8:
          pRVar10 = local_a0;
          if (!bVar6) {
            return unaff_R13D;
          }
        }
      }
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      pp_Var3 = (rawpack->super_RTPMemoryObject)._vptr_RTPMemoryObject;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        (*pp_Var3[1])(rawpack);
      }
      else {
        (**pp_Var3)(rawpack);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
      }
      iVar7 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1f])();
      rawpack = (RTPRawPacket *)CONCAT44(extraout_var_00,iVar7);
    } while (rawpack != (RTPRawPacket *)0x0);
  }
  this_00 = &this->rtcpsched;
  local_a0 = (RTPSources *)RTCPScheduler::CalculateDeterministicInterval(this_00,false);
  if (RTPTime::CurrentTime()::s_initialized == '\0') {
    RTPTime::CurrentTime()::s_initialized = '\x01';
    clock_gettime(0,&local_98);
    clock_gettime(1,&local_60);
    local_98.tv_sec = (__time_t)((double)local_98.tv_nsec * 1e-09 + (double)local_98.tv_sec);
    RTPTime::CurrentTime()::s_startOffet =
         (double)local_98.tv_sec - ((double)local_60.tv_nsec * 1e-09 + (double)local_60.tv_sec);
  }
  else {
    clock_gettime(1,&local_98);
    local_98.tv_sec =
         (__time_t)
         ((double)local_98.tv_nsec * 1e-09 + (double)local_98.tv_sec +
         RTPTime::CurrentTime()::s_startOffet);
  }
  local_60.tv_sec = (__time_t)(this->sendermultiplier * (double)local_a0);
  local_38.m_t = this->membermultiplier * (double)local_a0;
  local_40.m_t = this->byemultiplier * (double)local_a0;
  local_48.m_t = this->collisionmultiplier * (double)local_a0;
  local_50.m_t = (double)local_a0 * this->notemultiplier;
  RTPSources::MultipleTimeouts
            (&(this->sources).super_RTPSources,(RTPTime *)&local_98,(RTPTime *)&local_60,&local_40,
             &local_38,&local_50);
  RTPCollisionList::Timeout(&this->collisionlist,(RTPTime *)&local_98,&local_48);
  bVar6 = RTCPScheduler::IsTime(this_00);
  if (!bVar6) {
    return 0;
  }
  p_Var9 = (this->byepackets).
           super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 == (_List_node_base *)&this->byepackets) {
    iVar7 = RTCPPacketBuilder::BuildNextPacket(&this->rtcpbuilder,&local_a8);
    if (-1 < iVar7) {
      iVar7 = SendRTCPData(this,local_a8->compoundpacket,local_a8->compoundpacketlength);
      if (-1 < iVar7) {
        this->sentpackets = true;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_a8);
        goto LAB_0011d032;
      }
      goto LAB_0011d063;
    }
  }
  else {
    local_a8 = (RTCPCompoundPacket *)p_Var9[1]._M_next;
    psVar1 = &(this->byepackets).
              super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var9,0x18);
    iVar7 = SendRTCPData(this,local_a8->compoundpacket,local_a8->compoundpacketlength);
    if (-1 < iVar7) {
      this->sentpackets = true;
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_a8);
      p_Var9 = (this->byepackets).
               super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var9 != (_List_node_base *)&this->byepackets) {
        RTCPScheduler::ScheduleBYEPacket(this_00,(size_t)p_Var9[1]._M_next[2]._M_next);
      }
LAB_0011d032:
      RTCPScheduler::AnalyseOutgoing(this_00,local_a8);
      pRVar5 = local_a8;
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (local_a8 != (RTCPCompoundPacket *)0x0) {
          (*(local_a8->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(local_a8);
        }
      }
      else {
        (**(local_a8->super_RTPMemoryObject)._vptr_RTPMemoryObject)(local_a8);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar5);
      }
      bVar6 = true;
      goto LAB_0011d0b3;
    }
LAB_0011d063:
    pRVar5 = local_a8;
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      if (local_a8 != (RTCPCompoundPacket *)0x0) {
        (*(code *)((_List_node_base *)(local_a8->super_RTPMemoryObject)._vptr_RTPMemoryObject)->
                  _M_prev)(local_a8);
      }
    }
    else {
      (*(code *)((_List_node_base *)(local_a8->super_RTPMemoryObject)._vptr_RTPMemoryObject)->
                _M_next)(local_a8);
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar5);
    }
  }
  unaff_R13D = iVar7;
  bVar6 = false;
LAB_0011d0b3:
  if (bVar6) {
    return 0;
  }
  return unaff_R13D;
}

Assistant:

int RTPSession::ProcessPolledData()
{
	RTPRawPacket *rawpack;
	int status;
	
	SOURCES_LOCK
	while ((rawpack = rtptrans->GetNextPacket()) != 0)
	{
		if (m_changeIncomingData)
		{
			// Provide a way to change incoming data, for decryption for example
			if (!OnChangeIncomingData(rawpack))
			{
				RTPDelete(rawpack,GetMemoryManager());
				continue;
			}
		}

		sources.ClearOwnCollisionFlag();

		// since our sources instance also uses the scheduler (analysis of incoming packets)
		// we'll lock it
		SCHED_LOCK
		if ((status = sources.ProcessRawPacket(rawpack,rtptrans,acceptownpackets)) < 0)
		{
			SCHED_UNLOCK
			SOURCES_UNLOCK
			RTPDelete(rawpack,GetMemoryManager());
			return status;
		}
		SCHED_UNLOCK
				
		if (sources.DetectedOwnCollision()) // collision handling!
		{
			bool created;
			
			if ((status = collisionlist.UpdateAddress(rawpack->GetSenderAddress(),rawpack->GetReceiveTime(),&created)) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(rawpack,GetMemoryManager());
				return status;
			}

			if (created) // first time we've encountered this address, send bye packet and
			{            // change our own SSRC
				PACKSENT_LOCK
				bool hassentpackets = sentpackets;
				PACKSENT_UNLOCK

				if (hassentpackets)
				{
					// Only send BYE packet if we've actually sent data using this
					// SSRC
					
					RTCPCompoundPacket *rtcpcomppack;

					BUILDER_LOCK
					if ((status = rtcpbuilder.BuildBYEPacket(&rtcpcomppack,0,0,useSR_BYEifpossible)) < 0)
					{
						BUILDER_UNLOCK
						SOURCES_UNLOCK
						RTPDelete(rawpack,GetMemoryManager());
						return status;
					}
					BUILDER_UNLOCK

					byepackets.push_back(rtcpcomppack);
					if (byepackets.size() == 1) // was the first packet, schedule a BYE packet (otherwise there's already one scheduled)
					{
						SCHED_LOCK
						rtcpsched.ScheduleBYEPacket(rtcpcomppack->GetCompoundPacketLength());
						SCHED_UNLOCK
					}
				}
				// bye packet is built and scheduled, now change our SSRC
				// and reset the packet count in the transmitter
				
				BUILDER_LOCK
				uint32_t newssrc = packetbuilder.CreateNewSSRC(sources);
				BUILDER_UNLOCK
					
				PACKSENT_LOCK
				sentpackets = false;
				PACKSENT_UNLOCK
	
				// remove old entry in source table and add new one

				if ((status = sources.DeleteOwnSSRC()) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
				if ((status = sources.CreateOwnSSRC(newssrc)) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
			}
		}
		RTPDelete(rawpack,GetMemoryManager());
	}

	SCHED_LOCK
	RTPTime d = rtcpsched.CalculateDeterministicInterval(false);
	SCHED_UNLOCK
	
	RTPTime t = RTPTime::CurrentTime();
	double Td = d.GetDouble();
	RTPTime sendertimeout = RTPTime(Td*sendermultiplier);
	RTPTime generaltimeout = RTPTime(Td*membermultiplier);
	RTPTime byetimeout = RTPTime(Td*byemultiplier);
	RTPTime colltimeout = RTPTime(Td*collisionmultiplier);
	RTPTime notetimeout = RTPTime(Td*notemultiplier);
	
	sources.MultipleTimeouts(t,sendertimeout,byetimeout,generaltimeout,notetimeout);
	collisionlist.Timeout(t,colltimeout);
	
	// We'll check if it's time for RTCP stuff

	SCHED_LOCK
	bool istime = rtcpsched.IsTime();
	SCHED_UNLOCK
	
	if (istime)
	{
		RTCPCompoundPacket *pack;
	
		// we'll check if there's a bye packet to send, or just a normal packet

		if (byepackets.empty())
		{
			BUILDER_LOCK
			if ((status = rtcpbuilder.BuildNextPacket(&pack)) < 0)
			{
				BUILDER_UNLOCK
				SOURCES_UNLOCK
				return status;
			}
			BUILDER_UNLOCK
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
		
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
		}
		else
		{
			pack = *(byepackets.begin());
			byepackets.pop_front();
			
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
			
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
			
			if (!byepackets.empty()) // more bye packets to send, schedule them
			{
				SCHED_LOCK
				rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				SCHED_UNLOCK
			}
		}
		
		SCHED_LOCK
		rtcpsched.AnalyseOutgoing(*pack);
		SCHED_UNLOCK

		RTPDelete(pack,GetMemoryManager());
	}
	SOURCES_UNLOCK
	return 0;
}